

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

int32_t intersect_skewed_uint16
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l,uint16_t *buffer)

{
  uint16_t target3_00;
  uint16_t target4_00;
  uint16_t uVar1;
  uint16_t uVar2;
  int32_t iVar3;
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  int32_t index;
  uint16_t val_s;
  uint16_t target2_1;
  uint16_t target1_1;
  uint16_t target4;
  uint16_t target3;
  uint16_t target2;
  uint16_t target1;
  int32_t index4;
  int32_t index3;
  int32_t index2;
  int32_t index1;
  size_t idx_s;
  size_t idx_l;
  size_t pos;
  int32_t local_60;
  int32_t local_5c;
  int32_t local_58;
  int32_t local_54;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  long local_18;
  int32_t local_c;
  
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  if (in_RSI == 0) {
    local_c = 0;
  }
  else {
    local_54 = 0;
    local_58 = 0;
    local_5c = 0;
    local_60 = 0;
    local_38 = in_R8;
    local_30 = in_RCX;
    local_28 = in_RDX;
    local_20 = in_RSI;
    local_18 = in_RDI;
    while( true ) {
      if (local_20 < local_50 + 4 || local_30 <= local_48) break;
      uVar1 = *(uint16_t *)(local_18 + local_50 * 2);
      uVar2 = *(uint16_t *)(local_18 + 2 + local_50 * 2);
      target3_00 = *(uint16_t *)(local_18 + 4 + local_50 * 2);
      target4_00 = *(uint16_t *)(local_18 + 6 + local_50 * 2);
      binarySearch4((uint16_t *)(local_28 + local_48 * 2),(int)local_30 - (int)local_48,uVar1,uVar2,
                    target3_00,target4_00,&local_54,&local_58,&local_5c,&local_60);
      if (((long)local_54 + local_48 < local_30) &&
         (*(uint16_t *)(local_28 + (local_48 + (long)local_54) * 2) == uVar1)) {
        *(uint16_t *)(local_38 + local_40 * 2) = uVar1;
        local_40 = local_40 + 1;
      }
      if (((long)local_58 + local_48 < local_30) &&
         (*(uint16_t *)(local_28 + (local_48 + (long)local_58) * 2) == uVar2)) {
        *(uint16_t *)(local_38 + local_40 * 2) = uVar2;
        local_40 = local_40 + 1;
      }
      if (((long)local_5c + local_48 < local_30) &&
         (*(uint16_t *)(local_28 + (local_48 + (long)local_5c) * 2) == target3_00)) {
        *(uint16_t *)(local_38 + local_40 * 2) = target3_00;
        local_40 = local_40 + 1;
      }
      if (((long)local_60 + local_48 < local_30) &&
         (*(uint16_t *)(local_28 + (local_48 + (long)local_60) * 2) == target4_00)) {
        *(uint16_t *)(local_38 + local_40 * 2) = target4_00;
        local_40 = local_40 + 1;
      }
      local_50 = local_50 + 4;
      local_48 = (long)local_60 + local_48;
    }
    if ((local_50 + 2 <= local_20) && (local_48 < local_30)) {
      uVar1 = *(uint16_t *)(local_18 + local_50 * 2);
      uVar2 = *(uint16_t *)(local_18 + 2 + local_50 * 2);
      binarySearch2((uint16_t *)(local_28 + local_48 * 2),(int)local_30 - (int)local_48,uVar1,uVar2,
                    &local_54,&local_58);
      if (((long)local_54 + local_48 < local_30) &&
         (*(uint16_t *)(local_28 + (local_48 + (long)local_54) * 2) == uVar1)) {
        *(uint16_t *)(local_38 + local_40 * 2) = uVar1;
        local_40 = local_40 + 1;
      }
      if (((long)local_58 + local_48 < local_30) &&
         (*(uint16_t *)(local_28 + (local_48 + (long)local_58) * 2) == uVar2)) {
        *(uint16_t *)(local_38 + local_40 * 2) = uVar2;
        local_40 = local_40 + 1;
      }
      local_50 = local_50 + 2;
      local_48 = (long)local_58 + local_48;
    }
    if ((local_50 < local_20) && (local_48 < local_30)) {
      uVar1 = *(uint16_t *)(local_18 + local_50 * 2);
      iVar3 = binarySearch((uint16_t *)(local_28 + local_48 * 2),(int)local_30 - (int)local_48,uVar1
                          );
      if (-1 < iVar3) {
        *(uint16_t *)(local_38 + local_40 * 2) = uVar1;
        local_40 = local_40 + 1;
      }
    }
    local_c = (int32_t)local_40;
  }
  return local_c;
}

Assistant:

int32_t intersect_skewed_uint16(const uint16_t *small, size_t size_s,
                                const uint16_t *large, size_t size_l,
                                uint16_t *buffer) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }
    int32_t index1 = 0, index2 = 0, index3 = 0, index4 = 0;
    while ((idx_s + 4 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        uint16_t target3 = small[idx_s + 2];
        uint16_t target4 = small[idx_s + 3];
        binarySearch4(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, target3, target4, &index1, &index2, &index3,
                      &index4);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        if ((index3 + idx_l < size_l) && (large[idx_l + index3] == target3)) {
            buffer[pos++] = target3;
        }
        if ((index4 + idx_l < size_l) && (large[idx_l + index4] == target4)) {
            buffer[pos++] = target4;
        }
        idx_s += 4;
        idx_l += index4;
    }
    if ((idx_s + 2 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        binarySearch2(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, &index1, &index2);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        idx_s += 2;
        idx_l += index2;
    }
    if ((idx_s < size_s) && (idx_l < size_l)) {
        uint16_t val_s = small[idx_s];
        int32_t index =
            binarySearch(large + idx_l, (int32_t)(size_l - idx_l), val_s);
        if (index >= 0) buffer[pos++] = val_s;
    }
    return (int32_t)pos;
}